

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

string __thiscall mjs::to_string(mjs *this,gc_heap *h,double m)

{
  undefined8 extraout_RDX;
  string sVar1;
  wstring local_48;
  wstring_view local_28;
  
  number_to_string_abi_cxx11_(&local_48,(mjs *)h,m);
  local_28._M_len = local_48._M_string_length;
  local_28._M_str = local_48._M_dataplus._M_p;
  string::string((string *)this,h,&local_28);
  std::__cxx11::wstring::~wstring((wstring *)&local_48);
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string to_string(gc_heap& h, double m) {
    return string{h, number_to_string(m)};
}